

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O0

void __thiscall
cubeb_init_destroy_context_Test::cubeb_init_destroy_context_Test
          (cubeb_init_destroy_context_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__cubeb_init_destroy_context_Test_001b41f0;
  return;
}

Assistant:

TEST(cubeb, init_destroy_context)
{
  int r;
  cubeb * ctx;
  char const * backend_id;

  r = common_init(&ctx, "test_sanity");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  backend_id = cubeb_get_backend_id(ctx);
  ASSERT_TRUE(backend_id);

  fprintf(stderr, "Backend: %s\n", backend_id);

  cubeb_destroy(ctx);
}